

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  long *in_RSI;
  long *in_RDI;
  realtype *B_colj;
  realtype *A_colj;
  sunindextype smu;
  sunindextype mu;
  sunindextype ml;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  SUNMatrix in_stack_ffffffffffffffa8;
  undefined4 local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_4;
  
  iVar4 = SMCompatible_Band(in_stack_ffffffffffffffa8,(SUNMatrix)0xed29ed);
  if (iVar4 == 0) {
    local_4 = -0x2bd;
  }
  else {
    if ((*(int *)(*in_RSI + 0xc) < *(int *)(*in_RDI + 0xc)) ||
       (*(int *)(*in_RSI + 0x10) < *(int *)(*in_RDI + 0x10))) {
      if (*(int *)(*in_RDI + 0x10) < *(int *)(*in_RSI + 0x10)) {
        in_stack_ffffffffffffffbc = *(int *)(*in_RSI + 0x10);
      }
      else {
        in_stack_ffffffffffffffbc = *(int *)(*in_RDI + 0x10);
      }
      if (*(int *)(*in_RDI + 0xc) < *(int *)(*in_RSI + 0xc)) {
        in_stack_ffffffffffffffb8 = *(undefined4 *)(*in_RSI + 0xc);
      }
      else {
        in_stack_ffffffffffffffb8 = *(undefined4 *)(*in_RDI + 0xc);
      }
      if (*(int *)(*in_RDI + 0x14) < *(int *)(*in_RSI + 0x14)) {
        local_4c = *(int *)(*in_RSI + 0x14);
      }
      else {
        local_4c = *(int *)(*in_RDI + 0x14);
      }
      iVar4 = local_4c + in_stack_ffffffffffffffbc + 1;
      *(undefined4 *)(*in_RSI + 0xc) = in_stack_ffffffffffffffb8;
      *(int *)(*in_RSI + 0x10) = in_stack_ffffffffffffffbc;
      *(int *)(*in_RSI + 0x14) = local_4c;
      *(int *)(*in_RSI + 8) = iVar4;
      *(int *)(*in_RSI + 0x20) = *(int *)(*in_RSI + 4) * iVar4;
      pvVar5 = realloc(*(void **)(*in_RSI + 0x18),(long)(*(int *)(*in_RSI + 4) * iVar4) << 3);
      *(void **)(*in_RSI + 0x18) = pvVar5;
      for (local_20 = 0; local_20 < *(int *)(*in_RSI + 4); local_20 = local_20 + 1) {
        *(long *)(*(long *)(*in_RSI + 0x28) + (long)local_20 * 8) =
             *(long *)(*in_RSI + 0x18) + (long)(local_20 * iVar4) * 8;
      }
    }
    iVar4 = SUNMatZero_Band((SUNMatrix)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    if (iVar4 == 0) {
      for (local_20 = 0; local_20 < *(int *)(*in_RSI + 4); local_20 = local_20 + 1) {
        lVar2 = *(long *)(*(long *)(*in_RSI + 0x28) + (long)local_20 * 8);
        iVar4 = *(int *)(*in_RSI + 0x14);
        lVar3 = *(long *)(*(long *)(*in_RDI + 0x28) + (long)local_20 * 8);
        iVar1 = *(int *)(*in_RDI + 0x14);
        for (local_1c = -*(int *)(*in_RDI + 0xc); local_1c <= *(int *)(*in_RDI + 0x10);
            local_1c = local_1c + 1) {
          *(undefined8 *)(lVar2 + (long)iVar4 * 8 + (long)local_1c * 8) =
               *(undefined8 *)(lVar3 + (long)iVar1 * 8 + (long)local_1c * 8);
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x2bf;
    }
  }
  return local_4;
}

Assistant:

int SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j, colSize, ml, mu, smu;
  realtype *A_colj, *B_colj;

  /* Verify that A and B have compatible dimensions */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Grow B if A's bandwidth is larger */
  if ( (SM_UBAND_B(A) > SM_UBAND_B(B)) ||
       (SM_LBAND_B(A) > SM_LBAND_B(B)) ) {
    ml  = SUNMAX(SM_LBAND_B(B),SM_LBAND_B(A));
    mu  = SUNMAX(SM_UBAND_B(B),SM_UBAND_B(A));
    smu = SUNMAX(SM_SUBAND_B(B),SM_SUBAND_B(A));
    colSize = smu + ml + 1;
    SM_CONTENT_B(B)->mu = mu;
    SM_CONTENT_B(B)->ml = ml;
    SM_CONTENT_B(B)->s_mu = smu;
    SM_CONTENT_B(B)->ldim = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data = (realtype *)
      realloc(SM_CONTENT_B(B)->data, SM_COLUMNS_B(B) * colSize*sizeof(realtype));
    for (j=0; j<SM_COLUMNS_B(B); j++)
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
  }

  /* Perform operation */
  if (SUNMatZero_Band(B) != SUNMAT_SUCCESS)
    return SUNMAT_OPERATION_FAIL;
  for (j=0; j<SM_COLUMNS_B(B); j++) {
    B_colj = SM_COLUMN_B(B,j);
    A_colj = SM_COLUMN_B(A,j);
    for (i=-SM_UBAND_B(A); i<=SM_LBAND_B(A); i++)
      B_colj[i] = A_colj[i];
  }
  return SUNMAT_SUCCESS;
}